

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

Section * make_dummy_sec_from_pattern(GlobalVars *gv,LinkedSection *ls)

{
  char cVar1;
  char *__s;
  Section *n;
  LinkedSection *in_RSI;
  Section *dummy;
  char c;
  char *np;
  char *name;
  char *pp;
  unsigned_long in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  uint uVar2;
  int in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  uint7 in_stack_ffffffffffffffd0;
  char *local_28;
  char *local_18;
  
  __s = getpattern();
  if (__s == (char *)0x0) {
    ierror("make_dummy_sec_from_pattern(): no pattern?");
  }
  strlen(__s);
  local_28 = (char *)alloc(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  while( true ) {
    local_18 = __s;
    __s = local_18 + 1;
    cVar1 = *local_18;
    if (cVar1 == '\0') break;
    in_stack_ffffffffffffffc4 = (int)cVar1;
    if (in_stack_ffffffffffffffc4 != 0x2a) {
      if (in_stack_ffffffffffffffc4 == 0x3f) {
        *local_28 = '_';
        local_28 = local_28 + 1;
      }
      else if (in_stack_ffffffffffffffc4 == 0x5b) {
        if (*__s != '\0') {
          *local_28 = *__s;
          __s = local_18 + 2;
          local_28 = local_28 + 1;
        }
        while( true ) {
          local_18 = __s;
          uVar2 = in_stack_ffffffffffffffc0 & 0xffffff;
          if (*local_18 != '\0') {
            uVar2 = CONCAT13(*local_18 != ']',(int3)in_stack_ffffffffffffffc0);
          }
          in_stack_ffffffffffffffc0 = uVar2;
          if ((char)(uVar2 >> 0x18) == '\0') break;
          __s = local_18 + 1;
        }
        __s = local_18;
        if (*local_18 == ']') {
          __s = local_18 + 1;
        }
      }
      else {
        *local_28 = cVar1;
        local_28 = local_28 + 1;
      }
    }
  }
  *local_28 = '\0';
  n = create_section((ObjectUnit *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  n->lnksec = in_RSI;
  addtail(&in_RSI->sections,&n->n);
  return n;
}

Assistant:

static struct Section *make_dummy_sec_from_pattern(struct GlobalVars *gv,
                                                   struct LinkedSection *ls)
/* The first section is always an empty dummy section, which is needed
   for all symbol definitions by the linker script.
   Its 'lnksec' reference and 'va' will be set during linking.
   Its name is build from the first section pattern found. */
{
  char *pp,*name,*np,c;
  struct Section *dummy;

  pp = getpattern();
  if (pp == NULL)
    ierror("make_dummy_sec_from_pattern(): no pattern?");
  np = name = alloc(strlen(pp)+1);
  while (c = *pp++) {
    switch (c) {
      case '*':
        break;
      case '?':
        *np++ = '_';
        break;
      case '[':
        /* @@@ ! is not supported */
        if (*pp)
          *np++ = *pp++;
        while (*pp!='\0' && *pp!=']')
          pp++;
        if (*pp == ']')
          pp++;
        break;
      default:
        *np++ = c;
        break;
    }
  }
  *np = '\0';

  dummy = create_section(script_obj,name,NULL,0);
  dummy->lnksec = ls;  /* assign to ls */
  addtail(&ls->sections,&dummy->n);
  return dummy;
}